

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestHelpers.hpp
# Opt level: O1

bool testAccEval<float,GridMethodFast>
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,int numx,double tolerance,
               TasmanianSparseGrid *grid,string *message)

{
  pointer pdVar1;
  pointer pcVar2;
  pointer pfVar3;
  bool bVar4;
  pointer pfVar5;
  ulong uVar6;
  long lVar7;
  size_type __n;
  float *pfVar8;
  vector<float,_std::allocator<float>_> test_y;
  allocator_type local_b9;
  float *local_b8;
  double local_b0;
  vector<float,_std::allocator<float>_> local_a8;
  pointer local_90;
  vector<float,_std::allocator<float>_> local_88;
  double local_68;
  string *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  string local_50;
  
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*(long *)(grid + 8) == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)*(int *)(*(long *)(grid + 8) + 0x10);
  }
  local_b0 = (double)(long)numx;
  __n = lVar7 * (long)local_b0;
  local_90 = (pointer)0x0;
  local_68 = tolerance;
  local_60 = message;
  local_58 = y;
  std::vector<float,_std::allocator<float>_>::vector(&local_88,__n,&local_b9);
  local_90 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if (__n != 0) {
    pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    pfVar5 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pfVar5 = (float)*(double *)((long)pdVar1 + lVar7);
      pfVar5 = pfVar5 + 1;
      lVar7 = lVar7 + 8;
    } while (__n * 8 != lVar7);
  }
  if (*(long *)(grid + 8) == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)*(int *)(*(long *)(grid + 8) + 0x14);
  }
  local_b8 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::vector<float,_std::allocator<float>_>::vector(&local_88,lVar7 * (long)local_b0,&local_b9);
  pfVar3 = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pfVar5 = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pfVar5 != (pointer)0x0) {
    operator_delete(pfVar5,(long)pfVar3 - (long)pfVar5);
  }
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(grid + 8) == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)*(int *)(*(long *)(grid + 8) + 0x10);
  }
  if (0 < numx) {
    uVar6 = (ulong)(uint)numx;
    pfVar8 = local_b8;
    do {
      TasGrid::TasmanianSparseGrid::evaluateBatch((float *)grid,(int)pfVar8,(float *)0x1);
      pfVar8 = pfVar8 + lVar7;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  pfVar8 = local_b8;
  if (*(long *)(grid + 8) == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (long)*(int *)(*(long *)(grid + 8) + 0x14);
  }
  local_b0 = err1<std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>>
                       (lVar7 * (long)local_b0,&local_a8,local_58);
  pcVar2 = (local_60->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + local_60->_M_string_length);
  bVar4 = testPass(local_b0,local_68,&local_50,grid);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pfVar8 != (float *)0x0) {
    operator_delete(pfVar8,(long)local_90 - (long)pfVar8);
  }
  if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool testAccEval(std::vector<double> const &x, std::vector<double> const &y, int numx, double tolerance, TasmanianSparseGrid &grid, std::string message){
    std::vector<T> test_y, temp_x;
    std::vector<T> const &test_x = getVector(x, temp_x, Utils::size_mult(grid.getNumDimensions(), numx));

    if (std::is_same<EvalMethod, GridMethodBatch>::value){
        grid.evaluateBatch(test_x, test_y);
    }else if (std::is_same<EvalMethod, GridMethodFast>::value){
        test_y = std::vector<T>(Utils::size_mult(numx, grid.getNumOutputs()));
        Utils::Wrapper2D<T const> wx(grid.getNumDimensions(), test_x.data());
        Utils::Wrapper2D<T> wy(grid.getNumOutputs(), test_y.data());
        for(int i=0; i<numx; i++)
            grid.evaluateFast(wx.getStrip(i), wy.getStrip(i));
    }
    return testPass(err1(Utils::size_mult(numx, grid.getNumOutputs()), test_y, y), tolerance, message, grid);
}